

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall
TPZVec<TPZFMatrix<double>_>::TPZVec
          (TPZVec<TPZFMatrix<double>_> *this,int64_t size,TPZFMatrix<double> *copy)

{
  undefined1 auVar1 [16];
  int64_t *piVar2;
  TPZFMatrix<double> *this_00;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_016d1548;
  this->fStore = (TPZFMatrix<double> *)0x0;
  if (size < 0) {
    std::operator<<((ostream *)&std::cerr,
                    "TPZVec<TPZFMatrix<double>>::TPZVec(const int64_t, const T &) [T = TPZFMatrix<double>]"
                   );
    std::operator<<((ostream *)&std::cerr,"Bad parameter size, then size = 0.\n");
    std::ostream::flush();
    this->fNElements = 0;
    this->fNAlloc = 0;
  }
  else {
    if (size != 0) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = size;
      uVar3 = 0xffffffffffffffff;
      if (SUB168(auVar1 * ZEXT816(0x90),8) == 0) {
        uVar3 = SUB168(auVar1 * ZEXT816(0x90),0) | 8;
      }
      piVar2 = (int64_t *)operator_new__(uVar3);
      *piVar2 = size;
      lVar4 = 0;
      this_00 = (TPZFMatrix<double> *)(piVar2 + 1);
      do {
        TPZFMatrix<double>::TPZFMatrix(this_00);
        lVar4 = lVar4 + -0x90;
        this_00 = this_00 + 1;
      } while (size * -0x90 - lVar4 != 0);
      this->fStore = (TPZFMatrix<double> *)(piVar2 + 1);
    }
    this->fNElements = size;
    this->fNAlloc = size;
    lVar4 = 0;
    while (bVar5 = size != 0, size = size + -1, bVar5) {
      TPZFMatrix<double>::operator=
                ((TPZFMatrix<double> *)
                 ((long)&((TPZFMatrix<double> *)
                         (&((TPZFMatrix<double> *)
                           (&((TPZFMatrix<double> *)(&this->fStore->fPivot + -1))->fPivot + -1))->
                           fPivot + -1))->fPivot + lVar4 + 0xffffffffffffffc8U),copy);
      lVar4 = lVar4 + 0x90;
    }
  }
  return;
}

Assistant:

TPZVec<T>::TPZVec( const int64_t size, const T& copy ) : fStore( nullptr )
{
#ifndef PZNODEBUG
	if( size < 0 )
	{
		PZError << __PRETTY_FUNCTION__;
        PZError << "Bad parameter size, then size = 0.\n";
		PZError.flush();
		fNElements = 0;
        fNAlloc = 0;
		return;
	}
#endif
	
	if( size )
	{
		fStore = new T[size];
	}
	
	fNElements = size;
    fNAlloc = size;
	
	for( int64_t i = 0; i < size; i++ )
	{
		fStore[i] = copy;
	}
}